

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsCompare.c
# Opt level: O1

void JsEqualityExpressionEqCompare(JsValue *x,JsValue *y,JsValue *res)

{
  JsValueEnum JVar1;
  JsValueEnum JVar2;
  int iVar3;
  bool bVar4;
  undefined1 local_40 [8];
  JsValue tmp;
  
  res->type = JS_BOOLEAN;
  if (x->type == y->type) {
    switch(x->type) {
    case JS_UNDEFINED:
    case JS_NULL:
      goto switchD_00112598_caseD_0;
    case JS_BOOLEAN:
      bVar4 = (x->u).boolean == (y->u).boolean;
      break;
    case JS_NUMBER:
      if ((!NAN((x->u).number)) && (!NAN((y->u).number))) {
        (res->u).boolean = -(uint)((x->u).number == (y->u).number) & 1;
        return;
      }
      goto LAB_001126fb;
    case JS_STRING:
      iVar3 = strcmp((x->u).string,(y->u).string);
      bVar4 = iVar3 == 0;
      break;
    case JS_OBJECT:
      bVar4 = (x->u).object == (y->u).object;
      break;
    default:
      JsAssert(0);
      goto LAB_001125f4;
    }
    *(uint *)&res->u = (uint)bVar4;
    return;
  }
LAB_001125f4:
  JVar1 = x->type;
  JVar2 = y->type;
  if ((JVar1 == JS_NULL && JVar2 == JS_UNDEFINED) || (JVar2 == JS_NULL && JVar1 == JS_UNDEFINED)) {
switchD_00112598_caseD_0:
    (res->u).boolean = 1;
    return;
  }
  if (JVar2 == JS_STRING && JVar1 == JS_NUMBER) {
LAB_00112623:
    JsToNumber(y,(JsValue *)local_40);
  }
  else {
    if ((JVar2 == JS_NUMBER && JVar1 == JS_STRING) || (JVar1 == JS_BOOLEAN)) {
      JsToNumber(x,(JsValue *)local_40);
LAB_0011265c:
      x = (JsValue *)local_40;
      goto LAB_00112662;
    }
    if (JVar2 == JS_BOOLEAN) goto LAB_00112623;
    if (JVar2 != JS_OBJECT || 1 < JVar1 - JS_NUMBER) {
      if (JVar1 != JS_OBJECT || 1 < JVar2 - JS_NUMBER) {
LAB_001126fb:
        (res->u).boolean = 0;
        return;
      }
      JsToPrimitive(x,(uint)(JVar2 != JS_STRING),(JsValue *)local_40);
      goto LAB_0011265c;
    }
    JsToPrimitive(y,(uint)(JVar1 != JS_STRING),(JsValue *)local_40);
  }
  y = (JsValue *)local_40;
LAB_00112662:
  JsEqualityExpressionEqCompare(x,y,res);
  return;
}

Assistant:

void JsEqualityExpressionEqCompare( struct JsValue *x, struct JsValue *y, 
		struct JsValue *res){
	struct JsValue tmp;
	int xtype, ytype;
	int hit;
	res->type = JS_BOOLEAN;
	if (x->type == y->type)
		switch (x->type){
		case JS_UNDEFINED:
		case JS_NULL:
			res->u.boolean = TRUE;
			return;
		case JS_NUMBER:
			if (isnan(x->u.number) || isnan(y->u.number))
				res->u.boolean = FALSE;
			else
				res->u.boolean =  (x->u.number == y->u.number ? TRUE : FALSE);
			return;
		case JS_STRING:
			res->u.boolean = (strcmp(x->u.string,y->u.string) == 0 ? TRUE: FALSE);
			return;
		case JS_BOOLEAN:
			res->u.boolean = (x->u.boolean == y->u.boolean ? TRUE : FALSE);
			return;
		case JS_OBJECT:
			//refer the same object
			res->u.boolean = (x->u.object == y->u.object ? TRUE: FALSE);
			return;
		default:
			//未发现正确的类型
			JsAssert(FALSE);
		}
	xtype = x->type;
	ytype = y->type;
	if (xtype == JS_NULL && ytype == JS_UNDEFINED)
			res->u.boolean = TRUE;
	else if (xtype == JS_UNDEFINED && ytype == JS_NULL)
			res->u.boolean = TRUE;
	else if (xtype == JS_NUMBER && ytype == JS_STRING) {
			JsToNumber(y, &tmp);
			JsEqualityExpressionEqCompare(x, &tmp, res);
	} else if (xtype == JS_STRING && ytype == JS_NUMBER) {
			JsToNumber(x, &tmp);
			JsEqualityExpressionEqCompare(&tmp, y, res);
	} else if (xtype == JS_BOOLEAN) {
			JsToNumber( x, &tmp);
			JsEqualityExpressionEqCompare(&tmp, y, res);
	} else if (ytype == JS_BOOLEAN){
			JsToNumber(y, &tmp);
			JsEqualityExpressionEqCompare(x, &tmp, res);
	} else if ((xtype == JS_STRING || xtype == JS_NUMBER) &&
				ytype == JS_OBJECT) {
			if(xtype == JS_STRING)
				hit = JS_OBJECT_HIT_TYPE_STRING;
			else
				hit = JS_OBJECT_HIT_TYPE_NUMBER;
				
			JsToPrimitive(y, hit, &tmp);
			JsEqualityExpressionEqCompare(x, &tmp, res);
	} else if ((ytype == JS_STRING || ytype == JS_NUMBER) &&
				xtype == JS_OBJECT){
				
			if(ytype == JS_STRING)
				hit = JS_OBJECT_HIT_TYPE_STRING;
			else
				hit = JS_OBJECT_HIT_TYPE_NUMBER;
				
			JsToPrimitive(x, hit, &tmp);
			JsEqualityExpressionEqCompare(&tmp, y, res);
	} else{
		res->u.boolean  = FALSE;
	}
}